

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::metric(QWidget *this)

{
  PaintDeviceMetric in_ESI;
  
  metric((QWidget *)&this[-1].field_0x18,in_ESI);
  return;
}

Assistant:

int QWidget::metric(PaintDeviceMetric m) const
{
    QScreen *screen = this->screen();

    if (!screen) {
        if (m == PdmDpiX || m == PdmDpiY)
              return 72;
        return QPaintDevice::metric(m);
    }

    auto resolveDevicePixelRatio = [this, screen]() -> qreal {

        // Note: keep in sync with QBackingStorePrivate::backingStoreDevicePixelRatio()!
        static bool downscale = qEnvironmentVariableIntValue("QT_WIDGETS_HIGHDPI_DOWNSCALE") > 0;
        QWindow *window = this->window()->windowHandle();
        if (window)
            return downscale ? std::ceil(window->devicePixelRatio()) : window->devicePixelRatio();
        return screen->devicePixelRatio();
    };

    switch (m) {
    case PdmWidth:
        return data->crect.width();
    case PdmWidthMM:
        return data->crect.width() * screen->physicalSize().width() / screen->geometry().width();
    case PdmHeight:
        return data->crect.height();
    case PdmHeightMM:
        return data->crect.height() * screen->physicalSize().height() / screen->geometry().height();
    case PdmDepth:
        return screen->depth();
    case PdmDpiX:
        for (const QWidget *p = this; p; p = p->parentWidget()) {
            if (p->d_func()->extra && p->d_func()->extra->customDpiX)
                return p->d_func()->extra->customDpiX;
        }
        return qRound(screen->logicalDotsPerInchX());
    case PdmDpiY:
        for (const QWidget *p = this; p; p = p->parentWidget()) {
            if (p->d_func()->extra && p->d_func()->extra->customDpiY)
                return p->d_func()->extra->customDpiY;
        }
        return qRound(screen->logicalDotsPerInchY());
    case PdmPhysicalDpiX:
        return qRound(screen->physicalDotsPerInchX());
    case PdmPhysicalDpiY:
        return qRound(screen->physicalDotsPerInchY());
    case PdmDevicePixelRatio:
        return resolveDevicePixelRatio();
    case PdmDevicePixelRatioScaled:
        return QPaintDevice::devicePixelRatioFScale() * resolveDevicePixelRatio();
    case PdmDevicePixelRatioF_EncodedA:
        Q_FALLTHROUGH();
    case PdmDevicePixelRatioF_EncodedB:
        return QPaintDevice::encodeMetricF(m, resolveDevicePixelRatio());
    default:
        break;
    }
    return QPaintDevice::metric(m);
}